

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trackableobject.h
# Opt level: O3

void __thiscall Trackableobject::append(Trackableobject *this,centroid c,rect *r)

{
  iterator *piVar1;
  _Map_pointer pppVar2;
  _Map_pointer pppVar3;
  _Elt_pointer ppVar4;
  pair<float,_float> pVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  pair<float,_float> pVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  int local_78;
  int iStack_74;
  pair<centroid,_rect> local_60;
  float local_48;
  float fStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  pppVar2 = (this->locations).c.
            super__Deque_base<std::pair<centroid,_rect>,_std::allocator<std::pair<centroid,_rect>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  lVar9 = (long)this->maxRemenbers;
  if (((long)(this->locations).c.
             super__Deque_base<std::pair<centroid,_rect>,_std::allocator<std::pair<centroid,_rect>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last -
       (long)(this->locations).c.
             super__Deque_base<std::pair<centroid,_rect>,_std::allocator<std::pair<centroid,_rect>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) * -0x5555555555555555 +
      ((long)(this->locations).c.
             super__Deque_base<std::pair<centroid,_rect>,_std::allocator<std::pair<centroid,_rect>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur -
       (long)(this->locations).c.
             super__Deque_base<std::pair<centroid,_rect>,_std::allocator<std::pair<centroid,_rect>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) * -0x5555555555555555 +
      (((long)pppVar2 -
        (long)(this->locations).c.
              super__Deque_base<std::pair<centroid,_rect>,_std::allocator<std::pair<centroid,_rect>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
      (ulong)(pppVar2 == (_Map_pointer)0x0)) * 0x15 == lVar9) {
    std::deque<std::pair<centroid,_rect>,_std::allocator<std::pair<centroid,_rect>_>_>::pop_front
              ((deque<std::pair<centroid,_rect>,_std::allocator<std::pair<centroid,_rect>_>_> *)this
              );
    lVar9 = (long)this->maxRemenbers;
  }
  pppVar3 = (this->speeds).c.
            super__Deque_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_node;
  if (((long)(this->speeds).c.
             super__Deque_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>.
             _M_impl.super__Deque_impl_data._M_start._M_last -
       (long)(this->speeds).c.
             super__Deque_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>.
             _M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
      ((long)(this->speeds).c.
             super__Deque_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_cur -
       (long)(this->speeds).c.
             super__Deque_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
      ((((ulong)((long)pppVar3 -
                (long)(this->speeds).c.
                      super__Deque_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
      (ulong)(pppVar3 == (_Map_pointer)0x0)) * 0x40 == lVar9) {
    std::deque<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>::pop_front
              (&(this->speeds).c);
    lVar9 = (long)this->maxRemenbers;
  }
  pppVar3 = (this->accelerations).c.
            super__Deque_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_node;
  if (((long)(this->accelerations).c.
             super__Deque_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>.
             _M_impl.super__Deque_impl_data._M_start._M_last -
       (long)(this->accelerations).c.
             super__Deque_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>.
             _M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
      ((long)(this->accelerations).c.
             super__Deque_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_cur -
       (long)(this->accelerations).c.
             super__Deque_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
      ((((ulong)((long)pppVar3 -
                (long)(this->accelerations).c.
                      super__Deque_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
      (ulong)(pppVar3 == (_Map_pointer)0x0)) * 0x40 == lVar9) {
    std::deque<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>::pop_front
              (&(this->accelerations).c);
  }
  local_60.second.x1 = r->x1;
  local_60.second.y1 = r->y1;
  local_60.second.x2 = r->x2;
  local_60.second.y2 = r->y2;
  local_60.first = c;
  std::deque<std::pair<centroid,rect>,std::allocator<std::pair<centroid,rect>>>::
  emplace_back<std::pair<centroid,rect>>
            ((deque<std::pair<centroid,rect>,std::allocator<std::pair<centroid,rect>>> *)this,
             &local_60);
  local_78 = c.x;
  iStack_74 = c.y;
  fVar11 = (float)local_78;
  fVar12 = (float)iStack_74;
  fVar13 = fVar11 - (this->lastlocation).first;
  fVar14 = fVar12 - (this->lastlocation).second;
  local_60.first.y = fVar14;
  local_60.first.x = fVar13;
  ppVar4 = (this->speeds).c.
           super__Deque_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVar4 == (this->speeds).c.
                super__Deque_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    local_48 = fVar13;
    fStack_44 = fVar14;
    uStack_40 = 0;
    uStack_3c = 0;
    std::deque<std::pair<float,float>,std::allocator<std::pair<float,float>>>::
    _M_push_back_aux<std::pair<float,float>>
              ((deque<std::pair<float,float>,std::allocator<std::pair<float,float>>> *)&this->speeds
               ,(pair<float,_float> *)&local_60);
    fVar13 = local_48;
    fVar14 = fStack_44;
  }
  else {
    *ppVar4 = (pair<float,_float>)local_60.first;
    piVar1 = &(this->speeds).c.
              super__Deque_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>.
              _M_impl.super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  pVar10.second = fVar12;
  pVar10.first = fVar11;
  pVar5.second = fVar14;
  pVar5.first = fVar13;
  this->lastlocation = pVar10;
  this->lastspeed = pVar5;
  iVar6 = r->y1;
  iVar7 = r->x2;
  iVar8 = r->y2;
  (this->predRect).x1 = (int)((float)r->x1 + fVar13);
  (this->predRect).y1 = (int)((float)iVar6 + fVar14);
  (this->predRect).x2 = (int)((float)iVar7 + fVar13);
  (this->predRect).y2 = (int)((float)iVar8 + fVar14);
  local_60.first.y = (fVar12 - fVar12) - fVar14;
  local_60.first.x = (fVar11 - fVar11) - fVar13;
  ppVar4 = (this->accelerations).c.
           super__Deque_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVar4 == (this->accelerations).c.
                super__Deque_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<std::pair<float,float>,std::allocator<std::pair<float,float>>>::
    _M_push_back_aux<std::pair<float,float>>
              ((deque<std::pair<float,float>,std::allocator<std::pair<float,float>>> *)
               &this->accelerations,(pair<float,_float> *)&local_60);
  }
  else {
    *ppVar4 = (pair<float,_float>)local_60.first;
    piVar1 = &(this->accelerations).c.
              super__Deque_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>.
              _M_impl.super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  return;
}

Assistant:

void append(centroid c, rect r) {
		if(this->locations.size()==maxRemenbers){
			this->locations.pop();
		}
		if(this->speeds.size()==maxRemenbers){
			this->speeds.pop();
		}
		if(this->accelerations.size()==maxRemenbers){
			this->accelerations.pop();
		}
		this->locations.push(std::pair<centroid, rect>(c, r));

		// ----------------about the speeds and accelerations------------------------
		{
			//std::pair<float, float> lastlocation = speeds.back();
			float sX = c.x - lastlocation.first;
			float sY = c.y - lastlocation.second;
			
			speeds.push(std::pair<float, float>(sX, sY));

			lastlocation = std::pair<float, float>(c.x, c.y);
			lastspeed = std::pair<float, float>(sX, sY);

			predRect = rect(r.x1 + sX, r.y1 + sY, 
							r.x2 + sX, r.y2 + sY);
		}

		{

			float sX = c.x - lastlocation.first;
			float sY = c.y - lastlocation.second;

			float aX = sX - lastspeed.first;
			float aY = sY - lastspeed.second;

			accelerations.push(std::pair<float, float>(aX, aY));
		}
	}